

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void __thiscall
pstore::broker::command_processor::thread_entry(command_processor *this,fifo_path *fifo)

{
  double __x;
  double __x_00;
  message_ptr msg;
  not_null<const_char_*> local_40 [2];
  not_null<const_char_*> local_30;
  
  local_30.ptr_ = "Waiting for commands";
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_30);
  pstore::log((pstore *)0x6,__x);
  while( true ) {
    if (((this->commands_done_)._M_base._M_i & 1U) != 0) {
      local_40[0].ptr_ = "Exiting command thread";
      pstore::gsl::not_null<const_char_*>::ensure_invariant(local_40);
      pstore::log((pstore *)0x6,__x_00);
      return;
    }
    message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
    ::pop((message_queue<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>
           *)&msg);
    if ((__uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
         )msg._M_t.
          super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
          .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
         )0x0) break;
    process_command(this,fifo,
                    (message_type *)
                    msg._M_t.
                    super___uniq_ptr_impl<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pstore::brokerface::message_type_*,_std::default_delete<pstore::brokerface::message_type>_>
                    .super__Head_base<0UL,_pstore::brokerface::message_type_*,_false>._M_head_impl);
    message_pool::return_to_pool((message_pool *)pool,&msg);
    std::
    unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>
    ::~unique_ptr(&msg);
  }
  assert_failed("msg",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                ,0xdb);
}

Assistant:

void command_processor::thread_entry (brokerface::fifo_path const & fifo) {
            try {
                pstore::log (priority::info, "Waiting for commands");
                while (!commands_done_) {
                    brokerface::message_ptr msg = messages_.pop ();
                    PSTORE_ASSERT (msg);
                    this->process_command (fifo, *msg);
                    pool.return_to_pool (std::move (msg));
                }
            } catch (std::exception const & ex) {
                pstore::log (priority::error, "An error occurred: ", ex.what ());
            } catch (...) {
                pstore::log (priority::error, "Unknown error");
            }
            pstore::log (priority::info, "Exiting command thread");
        }